

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O2

void pbrt::Log<pbrt::Point2<int>&,pbrt::Bounds2<int>&>
               (LogLevel level,char *file,int line,char *fmt,Point2<int> *args,Bounds2<int> *args_1)

{
  string s;
  string local_40;
  
  StringPrintf<pbrt::Point2<int>&,pbrt::Bounds2<int>&>
            (&local_40,(pbrt *)fmt,(char *)args,&args_1->pMin,(Bounds2<int> *)args);
  Log(level,file,line,local_40._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

inline void Log(LogLevel level, const char *file, int line, const char *fmt,
                Args &&... args) {
#ifdef PBRT_IS_GPU_CODE
    Log(level, file, line, fmt);  // just the format string #yolo
#else
    std::string s = StringPrintf(fmt, std::forward<Args>(args)...);
    Log(level, file, line, s.c_str());
#endif
}